

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool __thiscall bssl::ssl_is_valid_trust_anchor_list(bssl *this,Span<const_unsigned_char> in)

{
  Span<const_unsigned_char> span;
  int iVar1;
  size_t sVar2;
  undefined1 local_50 [8];
  CBS id;
  undefined1 local_30 [8];
  CBS ids;
  Span<const_unsigned_char> in_local;
  
  span.size_ = (size_t)in.data_;
  span.data_ = (uchar *)this;
  id.len = (size_t)this;
  ids.len = (size_t)this;
  cbs_st::cbs_st((cbs_st *)local_30,span);
  do {
    sVar2 = CBS_len((CBS *)local_30);
    if (sVar2 == 0) {
      return true;
    }
    iVar1 = CBS_get_u8_length_prefixed((CBS *)local_30,(CBS *)local_50);
  } while ((iVar1 != 0) && (sVar2 = CBS_len((CBS *)local_50), sVar2 != 0));
  return false;
}

Assistant:

bool ssl_is_valid_trust_anchor_list(Span<const uint8_t> in) {
  CBS ids = in;
  while (CBS_len(&ids) > 0) {
    CBS id;
    if (!CBS_get_u8_length_prefixed(&ids, &id) ||  //
        CBS_len(&id) == 0) {
      return false;
    }
  }
  return true;
}